

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
anurbs::NurbsSurfaceGeometry<2L>::nonzero_pole_indices_at_span
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          NurbsSurfaceGeometry<2L> *this,Index span_u,Index span_v)

{
  long lVar1;
  Index IVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Index IVar5;
  reference plVar6;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_70;
  long local_68;
  Index j;
  Index i;
  iterator it;
  Index first_nonzero_pole_index_v;
  Index first_nonzero_pole_index_u;
  allocator<long> local_2a;
  undefined1 local_29;
  Index local_28;
  Index span_v_local;
  Index span_u_local;
  NurbsSurfaceGeometry<2L> *this_local;
  vector<long,_std::allocator<long>_> *indices;
  
  local_29 = 0;
  local_28 = span_v;
  span_v_local = span_u;
  span_u_local = (Index)this;
  this_local = (NurbsSurfaceGeometry<2L> *)__return_storage_ptr__;
  iVar3 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  std::allocator<long>::allocator(&local_2a);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,
             (CONCAT44(extraout_var,iVar3) + 1) * (CONCAT44(extraout_var_00,iVar4) + 1),&local_2a);
  std::allocator<long>::~allocator(&local_2a);
  IVar2 = span_v_local;
  iVar3 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  IVar5 = local_28;
  iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  it._M_current = (long *)((IVar5 - CONCAT44(extraout_var_02,iVar4)) + 1);
  i = (Index)std::vector<long,_std::allocator<long>_>::begin(__return_storage_ptr__);
  for (j = 0; IVar5 = j, iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(),
      IVar5 < CONCAT44(extraout_var_03,iVar4) + 1; j = j + 1) {
    for (local_68 = 0; lVar1 = local_68,
        iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(),
        lVar1 < CONCAT44(extraout_var_04,iVar4) + 1; local_68 = local_68 + 1) {
      IVar5 = to_single_index(this,(IVar2 - CONCAT44(extraout_var_01,iVar3)) + 1 + j,
                              (long)it._M_current + local_68);
      local_70 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator++((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &i,0);
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&local_70);
      *plVar6 = IVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> nonzero_pole_indices_at_span(const Index span_u, const Index span_v) const
    {
        std::vector<Index> indices((degree_u() + 1) * (degree_v() + 1));

        const Index first_nonzero_pole_index_u = span_u - degree_u() + 1;
        const Index first_nonzero_pole_index_v = span_v - degree_v() + 1;

        auto it = indices.begin();

        for (Index i = 0; i < degree_u() + 1; i++) {
            for (Index j = 0; j < degree_v() + 1; j++) {
                *(it++) = to_single_index(first_nonzero_pole_index_u + i, first_nonzero_pole_index_v + j);
            }
        }

        return indices;
    }